

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O1

void __thiscall qclab::qgates::SWAP<double>::setQubits(SWAP<double> *this,int *qubits)

{
  int iVar1;
  int iVar2;
  char *__assertion;
  
  iVar2 = *qubits;
  if (iVar2 < 0) {
    __assertion = "qubits[0] >= 0";
  }
  else {
    iVar1 = qubits[1];
    if (-1 < iVar1) {
      if (iVar2 != iVar1) {
        (this->qubits_)._M_elems[0] = qubits[iVar1 < iVar2];
        iVar2 = qubits[1];
        if (qubits[1] < *qubits) {
          iVar2 = *qubits;
        }
        (this->qubits_)._M_elems[1] = iVar2;
        return;
      }
      __assert_fail("qubits[0] != qubits[1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/SWAP.hpp"
                    ,0x3e,
                    "virtual void qclab::qgates::SWAP<double>::setQubits(const int *) [T = double]")
      ;
    }
    __assertion = "qubits[1] >= 0";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/SWAP.hpp"
                ,0x3d,
                "virtual void qclab::qgates::SWAP<double>::setQubits(const int *) [T = double]");
}

Assistant:

inline void setQubits( const int* qubits ) override {
          assert( qubits[0] >= 0 ) ; assert( qubits[1] >= 0 ) ;
          assert( qubits[0] != qubits[1] ) ;
          qubits_[0] = std::min( qubits[0] , qubits[1] ) ;
          qubits_[1] = std::max( qubits[0] , qubits[1] ) ;
        }